

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

bool Catch::TestCaseTracking::operator==(NameAndLocation *lhs,NameAndLocationRef *rhs)

{
  bool bVar1;
  bool local_41;
  StringRef local_30;
  NameAndLocationRef *local_20;
  NameAndLocationRef *rhs_local;
  NameAndLocation *lhs_local;
  
  if ((lhs->location).line == (rhs->location).line) {
    local_20 = rhs;
    rhs_local = (NameAndLocationRef *)lhs;
    StringRef::StringRef(&local_30,&lhs->name);
    bVar1 = StringRef::operator==(&local_30,local_20->name);
    local_41 = false;
    if (bVar1) {
      local_41 = SourceLineInfo::operator==((SourceLineInfo *)(rhs_local + 1),&local_20->location);
    }
    lhs_local._7_1_ = local_41;
  }
  else {
    lhs_local._7_1_ = false;
  }
  return lhs_local._7_1_;
}

Assistant:

bool operator==( NameAndLocation const& lhs,
                                NameAndLocationRef const& rhs ) {
            // This is a very cheap check that should have a very high hit rate.
            // If we get to SourceLineInfo::operator==, we will redo it, but the
            // cost of repeating is trivial at that point (we will be paying
            // multiple strcmp/memcmps at that point).
            if ( lhs.location.line != rhs.location.line ) { return false; }
            return StringRef( lhs.name ) == rhs.name &&
                   lhs.location == rhs.location;
        }